

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_peek_noise_scent(command *cmd)

{
  int iVar1;
  _Bool _Var2;
  ulong in_RAX;
  char *pcVar3;
  char kp;
  undefined8 local_38;
  
  local_38 = in_RAX & 0xffffffff00000000;
  do {
    wiz_hack_map((chunk *)cave,player,wiz_hack_map_peek_noise,&local_38);
    pcVar3 = format("Depth %d: ",local_38 & 0xffffffff);
    _Var2 = get_com(pcVar3,(char *)((long)&local_38 + 7));
    if (!_Var2) break;
    prt_map();
    iVar1 = (int)local_38;
    local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 1);
  } while (iVar1 < 99);
  local_38 = local_38 & 0xffffffff00000000;
  do {
    wiz_hack_map((chunk *)cave,player,wiz_hack_map_peek_scent,&local_38);
    pcVar3 = format("Depth %d: ",local_38 & 0xffffffff);
    _Var2 = get_com(pcVar3,(char *)((long)&local_38 + 7));
    if (!_Var2) break;
    prt_map();
    iVar1 = (int)local_38;
    local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 1);
  } while (iVar1 < 0x31);
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_peek_noise_scent(struct command *cmd)
{
	int i;
	char kp;

	/* Noise */
	for (i = 0; i < 100; i++) {
		wiz_hack_map(cave, player, wiz_hack_map_peek_noise, &i);

		/* Get key */
		if (!get_com(format("Depth %d: ", i), &kp)) break;

		/* Redraw map */
		prt_map();
	}

	/* Smell */
	for (i = 0; i < 50; i++) {
		wiz_hack_map(cave, player, wiz_hack_map_peek_scent, &i);

		/* Get key */
		if (!get_com(format("Depth %d: ", i), &kp)) break;

		/* Redraw map */
		prt_map();
	}

	/* Done */
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}